

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMaskUtil.cpp
# Opt level: O1

int ZXing::QRCode::MaskUtil::CalculateMaskPenalty(TritMatrix *matrix)

{
  ulong uVar1;
  pointer pTVar2;
  char *pcVar3;
  value_t vVar4;
  int iVar5;
  uint uVar6;
  value_t *pvVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  pointer pTVar11;
  pointer pTVar12;
  uint uVar13;
  pointer pTVar14;
  pointer pTVar15;
  long lVar16;
  long lVar17;
  pointer pTVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  pointer pTVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  array<bool,_4UL> white;
  char local_b4 [4];
  long local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  pointer local_90;
  int local_88;
  int local_84;
  long local_80;
  ulong local_78;
  TritMatrix *local_70;
  pointer local_68;
  pointer local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  iVar8 = ApplyMaskPenaltyRule1Internal(matrix,true);
  iVar10 = 0;
  local_88 = ApplyMaskPenaltyRule1Internal(matrix,false);
  iVar5 = matrix->_height;
  local_80 = (long)iVar5;
  local_78 = 0;
  if (1 < local_80) {
    uVar6 = matrix->_width;
    pTVar15 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
              super__Vector_impl_data._M_start;
    pTVar18 = pTVar15 + (ulong)uVar6 + 1;
    pTVar15 = pTVar15 + 1;
    uVar19 = 0;
    iVar21 = 0;
    do {
      if (1 < (int)uVar6) {
        uVar23 = 0;
        do {
          vVar4 = pTVar15[uVar23 - 1].value;
          if (((pTVar15[uVar23].value == true_v) == (vVar4 == true_v)) &&
             ((pTVar18[uVar23 - 1].value == true_v) == (vVar4 == true_v))) {
            iVar21 = iVar21 + (uint)((pTVar18[uVar23].value != true_v) != (vVar4 == true_v));
          }
          uVar23 = uVar23 + 1;
        } while (uVar6 - 1 != uVar23);
      }
      uVar19 = uVar19 + 1;
      pTVar18 = pTVar18 + uVar6;
      pTVar15 = pTVar15 + uVar6;
    } while (uVar19 != iVar5 - 1);
    local_78 = (ulong)(uint)(iVar21 * 3);
  }
  uVar6 = matrix->_width;
  uVar19 = (ulong)uVar6;
  local_a0 = (long)(int)uVar6;
  if (0 < iVar5) {
    local_84 = iVar8;
    local_70 = matrix;
    local_90 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_40 = local_a0 * 7;
    local_60 = local_90 + 1;
    lVar24 = 0;
    local_98 = 0;
    local_a8 = local_a0 + -7;
    local_b0 = local_80 + -7;
    local_50 = local_80;
    local_68 = local_90;
    do {
      pTVar15 = local_68 + uVar19;
      local_68 = pTVar15;
      if (0 < (int)uVar6) {
        local_38 = lVar24 * uVar19;
        uVar9 = 4;
        if ((uint)lVar24 < 4) {
          uVar9 = (uint)lVar24;
        }
        local_48 = (long)(int)-(uVar9 * uVar6);
        local_50 = local_50 - lVar24;
        iVar10 = 0xb;
        if ((int)local_50 < 0xb) {
          iVar10 = (int)local_50;
        }
        local_58 = (long)(int)((iVar10 + -7) * uVar6);
        uVar23 = 0;
        pTVar18 = local_60;
LAB_0018e9bd:
        pTVar11 = local_90 + uVar23 + lVar24 * uVar19;
        if (((long)uVar23 <= local_a0 + -7) && (pTVar11->value == true_v)) {
          pTVar12 = pTVar11 + 7;
          uVar20 = 0xffffffffffffffff;
          do {
            if (uVar20 == 5) goto LAB_0018ea13;
            lVar16 = uVar20 + 1;
            uVar1 = uVar20 + 1;
            pcVar3 = &DAT_001a2f6e + uVar20;
            uVar20 = uVar1;
          } while ((bool)*pcVar3 == (pTVar18[lVar16].value == true_v));
          if (5 < uVar1) {
LAB_0018ea13:
            uVar13 = 4;
            if ((uint)uVar23 < 4) {
              uVar13 = (uint)uVar23;
            }
            pTVar14 = pTVar11 + (int)-uVar13;
            pTVar22 = pTVar11;
            if (uVar23 != 0) {
              pTVar14 = pTVar11;
              pTVar22 = pTVar11 + (int)-uVar13;
            }
            bVar25 = pTVar22 >= pTVar14;
            if (pTVar22 < pTVar14) {
              if (pTVar22->value != true_v) {
                lVar16 = 1;
                do {
                  pTVar2 = pTVar22 + lVar16;
                  bVar25 = lVar16 == 4 || pTVar14 <= pTVar2;
                  if (bVar25) goto LAB_0018ea3f;
                  pcVar3 = local_b4 + lVar16;
                  lVar16 = lVar16 + 1;
                } while ((bool)*pcVar3 == (pTVar2->value == true_v));
              }
LAB_0018ea8b:
              iVar21 = (int)(local_a0 - uVar23);
              iVar10 = 0xb;
              if (iVar21 < 0xb) {
                iVar10 = iVar21;
              }
              pTVar22 = pTVar12 + (long)iVar10 + -7;
              if ((long)(local_a0 - uVar23) < 7) {
                pTVar22 = pTVar12;
                pTVar12 = pTVar12 + (long)iVar10 + -7;
              }
              bVar25 = pTVar12 >= pTVar22;
              if (pTVar12 < pTVar22) {
                if (pTVar12->value != true_v) {
                  lVar16 = 1;
                  do {
                    pTVar14 = pTVar12 + lVar16;
                    bVar25 = lVar16 == 4 || pTVar22 <= pTVar14;
                    if (bVar25) goto LAB_0018eac8;
                    pcVar3 = local_b4 + lVar16;
                    lVar16 = lVar16 + 1;
                  } while ((bool)*pcVar3 == (pTVar14->value == true_v));
                }
              }
              else {
LAB_0018eac8:
                if (bVar25) goto LAB_0018eacd;
              }
            }
            else {
LAB_0018ea3f:
              if (!bVar25) goto LAB_0018ea8b;
LAB_0018eacd:
              local_98 = (ulong)((int)local_98 + 1);
            }
          }
        }
        if ((lVar24 <= local_80 + -7) && (pTVar11->value == true_v)) {
          pTVar12 = pTVar11 + local_a0 * 7;
          lVar16 = 1;
          pTVar22 = pTVar15;
          do {
            if ((pTVar12 <= pTVar22) || (lVar16 == 7)) {
              pTVar22 = pTVar11 + (int)-(uVar9 * uVar6);
              if (lVar24 == 0) {
                pTVar11 = pTVar22;
                pTVar22 = local_90 + uVar23;
              }
              bVar25 = pTVar11 <= pTVar22;
              if (bVar25) goto LAB_0018eb9c;
              if (pTVar22->value == true_v) goto LAB_0018ebe6;
              lVar16 = 1;
              goto LAB_0018ebb8;
            }
            pvVar7 = &pTVar22->value;
            pTVar22 = pTVar22 + uVar19;
            pcVar3 = &DAT_001a2f6c + lVar16;
            lVar16 = lVar16 + 1;
          } while ((bool)*pcVar3 == (*pvVar7 == true_v));
        }
        goto LAB_0018ec68;
      }
LAB_0018ec7a:
      lVar24 = lVar24 + 1;
      local_60 = local_60 + uVar19;
      local_50 = local_80;
    } while (lVar24 != local_80);
    iVar10 = (int)local_98 * 0x28;
  }
  pTVar15 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar6 * iVar5 == 0) {
    lVar24 = 0;
  }
  else {
    lVar16 = 0;
    lVar24 = 0;
    do {
      lVar24 = lVar24 + (ulong)(pTVar15[lVar16].value == true_v);
      lVar16 = lVar16 + 1;
    } while ((int)(uVar6 * iVar5) != lVar16);
    lVar24 = lVar24 * 2;
  }
  lVar17 = (long)(*(int *)&(matrix->_data).
                           super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
                           super__Vector_impl_data._M_finish - (int)pTVar15);
  lVar24 = lVar24 - lVar17;
  lVar16 = -lVar24;
  if (0 < lVar24) {
    lVar16 = lVar24;
  }
  return (int)local_78 + iVar10 + local_88 + iVar8 + (int)((lVar16 * 10) / lVar17) * 10;
  while (pcVar3 = local_b4 + lVar16, lVar16 = lVar16 + 1,
        (bool)*pcVar3 == (pTVar22->value == true_v)) {
LAB_0018ebb8:
    pTVar22 = pTVar22 + local_a0;
    bVar25 = lVar16 == 4 || pTVar11 <= pTVar22;
    if (bVar25) goto LAB_0018eb9c;
  }
LAB_0018ebe6:
  pTVar11 = pTVar12 + local_58;
  if (local_50 < 7) {
    pTVar11 = pTVar12;
    pTVar12 = pTVar12 + local_58;
  }
  bVar25 = pTVar12 >= pTVar11;
  if (pTVar12 < pTVar11) {
    if (pTVar12->value != true_v) {
      lVar16 = 1;
      do {
        pTVar12 = pTVar12 + local_a0;
        bVar25 = lVar16 == 4 || pTVar11 <= pTVar12;
        if (bVar25) goto LAB_0018ec08;
        pcVar3 = local_b4 + lVar16;
        lVar16 = lVar16 + 1;
      } while ((bool)*pcVar3 == (pTVar12->value == true_v));
    }
    goto LAB_0018ec68;
  }
LAB_0018ec08:
  if (!bVar25) goto LAB_0018ec68;
LAB_0018ec0d:
  local_98 = (ulong)((int)local_98 + 1);
LAB_0018ec68:
  uVar23 = uVar23 + 1;
  pTVar18 = pTVar18 + 1;
  pTVar15 = pTVar15 + 1;
  if (uVar23 == uVar19) goto LAB_0018ec7a;
  goto LAB_0018e9bd;
LAB_0018eb9c:
  if (!bVar25) goto LAB_0018ebe6;
  goto LAB_0018ec0d;
}

Assistant:

int CalculateMaskPenalty(const TritMatrix& matrix)
{
	return MaskUtil::ApplyMaskPenaltyRule1(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule2(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule3(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule4(matrix);
}